

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_geometric.h
# Opt level: O0

Matrix3x4 * __thiscall
Matrix3x4::operator*(Matrix3x4 *__return_storage_ptr__,Matrix3x4 *this,Matrix3x4 *other)

{
  Matrix3x4 *other_local;
  Matrix3x4 *this_local;
  
  __return_storage_ptr__->m[0][0] =
       this->m[0][0] * other->m[0][0] + this->m[0][1] * other->m[1][0] +
       this->m[0][2] * other->m[2][0];
  __return_storage_ptr__->m[0][1] =
       this->m[0][0] * other->m[0][1] + this->m[0][1] * other->m[1][1] +
       this->m[0][2] * other->m[2][1];
  __return_storage_ptr__->m[0][2] =
       this->m[0][0] * other->m[0][2] + this->m[0][1] * other->m[1][2] +
       this->m[0][2] * other->m[2][2];
  __return_storage_ptr__->m[0][3] =
       this->m[0][0] * other->m[0][3] + this->m[0][1] * other->m[1][3] +
       this->m[0][2] * other->m[2][3] + this->m[0][3];
  __return_storage_ptr__->m[1][0] =
       this->m[1][0] * other->m[0][0] + this->m[1][1] * other->m[1][0] +
       this->m[1][2] * other->m[2][0];
  __return_storage_ptr__->m[1][1] =
       this->m[1][0] * other->m[0][1] + this->m[1][1] * other->m[1][1] +
       this->m[1][2] * other->m[2][1];
  __return_storage_ptr__->m[1][2] =
       this->m[1][0] * other->m[0][2] + this->m[1][1] * other->m[1][2] +
       this->m[1][2] * other->m[2][2];
  __return_storage_ptr__->m[1][3] =
       this->m[1][0] * other->m[0][3] + this->m[1][1] * other->m[1][3] +
       this->m[1][2] * other->m[2][3] + this->m[1][3];
  __return_storage_ptr__->m[2][0] =
       this->m[2][0] * other->m[0][0] + this->m[2][1] * other->m[1][0] +
       this->m[2][2] * other->m[2][0];
  __return_storage_ptr__->m[2][1] =
       this->m[2][0] * other->m[0][1] + this->m[2][1] * other->m[1][1] +
       this->m[2][2] * other->m[2][1];
  __return_storage_ptr__->m[2][2] =
       this->m[2][0] * other->m[0][2] + this->m[2][1] * other->m[1][2] +
       this->m[2][2] * other->m[2][2];
  __return_storage_ptr__->m[2][3] =
       this->m[2][0] * other->m[0][3] + this->m[2][1] * other->m[1][3] +
       this->m[2][2] * other->m[2][3] + this->m[2][3];
  return __return_storage_ptr__;
}

Assistant:

Matrix3x4 operator *(const Matrix3x4 &other)
	{
		Matrix3x4 result;

		result.m[0][0] = m[0][0]*other.m[0][0] + m[0][1]*other.m[1][0] + m[0][2]*other.m[2][0];
		result.m[0][1] = m[0][0]*other.m[0][1] + m[0][1]*other.m[1][1] + m[0][2]*other.m[2][1];
		result.m[0][2] = m[0][0]*other.m[0][2] + m[0][1]*other.m[1][2] + m[0][2]*other.m[2][2];
		result.m[0][3] = m[0][0]*other.m[0][3] + m[0][1]*other.m[1][3] + m[0][2]*other.m[2][3] + m[0][3];

		result.m[1][0] = m[1][0]*other.m[0][0] + m[1][1]*other.m[1][0] + m[1][2]*other.m[2][0];
		result.m[1][1] = m[1][0]*other.m[0][1] + m[1][1]*other.m[1][1] + m[1][2]*other.m[2][1];
		result.m[1][2] = m[1][0]*other.m[0][2] + m[1][1]*other.m[1][2] + m[1][2]*other.m[2][2];
		result.m[1][3] = m[1][0]*other.m[0][3] + m[1][1]*other.m[1][3] + m[1][2]*other.m[2][3] + m[1][3];

		result.m[2][0] = m[2][0]*other.m[0][0] + m[2][1]*other.m[1][0] + m[2][2]*other.m[2][0];
		result.m[2][1] = m[2][0]*other.m[0][1] + m[2][1]*other.m[1][1] + m[2][2]*other.m[2][1];
		result.m[2][2] = m[2][0]*other.m[0][2] + m[2][1]*other.m[1][2] + m[2][2]*other.m[2][2];
		result.m[2][3] = m[2][0]*other.m[0][3] + m[2][1]*other.m[1][3] + m[2][2]*other.m[2][3] + m[2][3];

		return result;
	}